

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump_image_header(opj_image_t *img_header,OPJ_BOOL dev_dump_flag,FILE *out_stream)

{
  uint local_28;
  undefined1 local_22;
  undefined1 local_21;
  OPJ_UINT32 compno;
  char tab [2];
  FILE *out_stream_local;
  OPJ_BOOL dev_dump_flag_local;
  opj_image_t *img_header_local;
  
  _compno = (FILE *)out_stream;
  if (dev_dump_flag == 0) {
    fprintf((FILE *)out_stream,"Image info {\n");
    local_22 = 9;
    local_21 = 0;
  }
  else {
    fprintf(_stdout,"[DEV] Dump an image_header struct {\n");
    local_22 = 0;
  }
  fprintf(_compno,"%s x0=%d, y0=%d\n",&local_22,(ulong)img_header->x0,(ulong)img_header->y0);
  fprintf(_compno,"%s x1=%d, y1=%d\n",&local_22,(ulong)img_header->x1,(ulong)img_header->y1);
  fprintf(_compno,"%s numcomps=%d\n",&local_22,(ulong)img_header->numcomps);
  if (img_header->comps != (opj_image_comp_t *)0x0) {
    for (local_28 = 0; local_28 < img_header->numcomps; local_28 = local_28 + 1) {
      fprintf(_compno,"%s\t component %d {\n",&local_22,(ulong)local_28);
      j2k_dump_image_comp_header(img_header->comps + local_28,dev_dump_flag,(FILE *)_compno);
      fprintf(_compno,"%s}\n",&local_22);
    }
  }
  fprintf(_compno,"}\n");
  return;
}

Assistant:

void j2k_dump_image_header(opj_image_t* img_header, OPJ_BOOL dev_dump_flag,
                           FILE* out_stream)
{
    char tab[2];

    if (dev_dump_flag) {
        fprintf(stdout, "[DEV] Dump an image_header struct {\n");
        tab[0] = '\0';
    } else {
        fprintf(out_stream, "Image info {\n");
        tab[0] = '\t';
        tab[1] = '\0';
    }

    fprintf(out_stream, "%s x0=%d, y0=%d\n", tab, img_header->x0, img_header->y0);
    fprintf(out_stream,     "%s x1=%d, y1=%d\n", tab, img_header->x1,
            img_header->y1);
    fprintf(out_stream, "%s numcomps=%d\n", tab, img_header->numcomps);

    if (img_header->comps) {
        OPJ_UINT32 compno;
        for (compno = 0; compno < img_header->numcomps; compno++) {
            fprintf(out_stream, "%s\t component %d {\n", tab, compno);
            j2k_dump_image_comp_header(&(img_header->comps[compno]), dev_dump_flag,
                                       out_stream);
            fprintf(out_stream, "%s}\n", tab);
        }
    }

    fprintf(out_stream, "}\n");
}